

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBoxShadow.cpp
# Opt level: O0

void __thiscall
Rml::GeometryBoxShadow::Generate
          (GeometryBoxShadow *this,Geometry *out_shadow_geometry,CallbackTexture *out_shadow_texture
          ,RenderManager *render_manager,Element *element,Geometry *background_border_geometry,
          BoxShadowList *shadow_list,CornerSizes border_radius,float opacity)

{
  Rectangle<float> *this_00;
  bool bVar1;
  int iVar2;
  float fVar3;
  Rectangle<float> RVar4;
  undefined1 local_2e0 [16];
  function<bool_(const_Rml::CallbackTextureInterface_&)> local_2d0;
  undefined1 local_2b0 [20];
  ColourbPremultiplied local_29c;
  Vector2f local_298;
  Vector2<float> local_290;
  uchar local_285;
  byte alpha;
  undefined1 local_278 [8];
  Mesh mesh;
  anon_class_72_6_c04b40ea texture_callback;
  Vector2Type local_1f0;
  Vector2<float> local_1e8;
  BoxShadowList *local_1e0;
  Vector2<float> local_1d4;
  Vector2Type local_1cc;
  Vector2Type VStack_1c4;
  Vector2f local_1bc;
  Vector2Type local_1b4;
  Vector2Type local_1ac;
  Vector2Type local_1a4;
  Vector2Type local_19c;
  Vector2Type local_194;
  undefined1 local_18c [8];
  RenderBox box;
  int i;
  Rectanglef texture_region;
  Vector2<float> local_140;
  Vector2<float> local_138;
  Vector2f local_130;
  Vector2f local_128;
  Vector2<float> local_120;
  Vector2<float> local_118;
  Vector2f local_110;
  Vector2f local_104;
  Vector2<float> local_fc;
  Vector2f offset;
  float extend;
  BoxShadow *shadow_1;
  iterator __end2;
  iterator __begin2;
  BoxShadowList *__range2;
  Vector2f extend_max;
  Vector2f extend_min;
  NumericValue local_b8;
  NumericValue local_b0;
  NumericValue local_a8;
  NumericValue local_a0;
  NumericValue local_98;
  NumericValue local_90;
  NumericValue local_88;
  reference local_80;
  BoxShadow *shadow;
  iterator __end1;
  iterator __begin1;
  BoxShadowList *__range1;
  Vector2i texture_dimensions;
  Vector2f element_offset_in_texture;
  float opacity_local;
  BoxShadowList *shadow_list_local;
  Geometry *background_border_geometry_local;
  Element *element_local;
  RenderManager *render_manager_local;
  CallbackTexture *out_shadow_texture_local;
  Geometry *out_shadow_geometry_local;
  CornerSizes border_radius_local;
  
  Vector2<float>::Vector2((Vector2<float> *)&texture_dimensions);
  Vector2<int>::Vector2((Vector2<int> *)&__range1);
  __end1 = ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::begin
                     ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)
                      background_border_geometry);
  shadow = (BoxShadow *)
           ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::end
                     ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)
                      background_border_geometry);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
                                *)&shadow);
    if (!bVar1) break;
    local_80 = __gnu_cxx::
               __normal_iterator<Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
               ::operator*(&__end1);
    local_90 = local_80->blur_radius;
    fVar3 = Element::ResolveLength((Element *)render_manager,local_90);
    NumericValue::NumericValue(&local_88,fVar3,PX);
    local_80->blur_radius = local_88;
    local_a0 = local_80->spread_distance;
    fVar3 = Element::ResolveLength((Element *)render_manager,local_a0);
    NumericValue::NumericValue(&local_98,fVar3,PX);
    local_80->spread_distance = local_98;
    local_b0 = local_80->offset_x;
    fVar3 = Element::ResolveLength((Element *)render_manager,local_b0);
    NumericValue::NumericValue(&local_a8,fVar3,PX);
    local_80->offset_x = local_a8;
    fVar3 = Element::ResolveLength((Element *)render_manager,local_80->offset_y);
    NumericValue::NumericValue(&local_b8,fVar3,PX);
    local_80->offset_y = local_b8;
    __gnu_cxx::
    __normal_iterator<Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
    ::operator++(&__end1);
  }
  Vector2<float>::Vector2(&extend_max);
  Vector2<float>::Vector2((Vector2<float> *)&__range2);
  __end2 = ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::begin
                     ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)
                      background_border_geometry);
  shadow_1 = (BoxShadow *)
             ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::end
                       ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)
                        background_border_geometry);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
                                *)&shadow_1);
    if (!bVar1) break;
    register0x00000000 =
         __gnu_cxx::
         __normal_iterator<Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
         ::operator*(&__end2);
    if ((register0x00000000->inset & 1U) == 0) {
      offset.x = (register0x00000000->blur_radius).number * 1.5 +
                 (register0x00000000->spread_distance).number;
      Vector2<float>::Vector2
                (&local_fc,(register0x00000000->offset_x).number,
                 (register0x00000000->offset_y).number);
      local_110 = extend_max;
      Vector2<float>::Vector2(&local_120,offset.x);
      local_118 = Vector2<float>::operator-(&local_fc,local_120);
      local_104 = Math::Min<Rml::Vector2<float>>(local_110,local_118);
      local_130 = (Vector2f)__range2;
      extend_max = local_104;
      Vector2<float>::Vector2(&local_140,offset.x);
      local_138 = Vector2<float>::operator+(&local_fc,local_140);
      local_128 = Math::Max<Rml::Vector2<float>>(local_130,local_138);
      __range2 = (BoxShadowList *)local_128;
    }
    __gnu_cxx::
    __normal_iterator<Rml::BoxShadow_*,_std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>_>
    ::operator++(&__end2);
  }
  Rectangle<float>::Rectangle((Rectangle<float> *)(box.border_radius._M_elems + 3));
  box.border_radius._M_elems[2] = 0.0;
  while( true ) {
    fVar3 = box.border_radius._M_elems[2];
    iVar2 = Element::GetNumBoxes((Element *)render_manager);
    if (iVar2 <= (int)fVar3) break;
    Element::GetRenderBox
              ((RenderBox *)local_18c,(Element *)render_manager,Border,
               (int)box.border_radius._M_elems[2]);
    local_1b4 = RenderBox::GetBorderOffset((RenderBox *)local_18c);
    local_1bc = RenderBox::GetFillSize((RenderBox *)local_18c);
    RVar4 = Rectangle<float>::FromPositionSize(local_1b4,local_1bc);
    local_1a4 = RVar4.p1;
    local_1ac = RVar4.p0;
    RVar4 = Rectangle<float>::Join((Rectangle<float> *)(box.border_radius._M_elems + 3),RVar4);
    local_194 = RVar4.p1;
    local_19c = RVar4.p0;
    box.border_radius._M_elems[2] = (float)((int)box.border_radius._M_elems[2] + 1);
    unique0x10000a9e = local_19c;
  }
  local_1d4 = Vector2<float>::operator-(&extend_max);
  local_1e0 = __range2;
  this_00 = (Rectangle<float> *)(box.border_radius._M_elems + 3);
  RVar4 = Rectangle<float>::Extend(this_00,local_1d4,(Vector2Type)__range2);
  VStack_1c4 = RVar4.p1;
  local_1cc = RVar4.p0;
  unique0x10000a96 = local_1cc;
  Math::ExpandToPixelGrid(this_00);
  local_1f0 = Rectangle<float>::TopLeft(this_00);
  local_1e8 = Vector2<float>::operator-(&local_1f0);
  texture_dimensions = (Vector2i)local_1e8;
  texture_callback.shadow_list.super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Rectangle<float>::Size(this_00);
  texture_callback.border_radius._M_elems._8_8_ =
       Vector2::operator_cast_to_Vector2
                 ((Vector2 *)
                  &texture_callback.shadow_list.
                   super__Vector_base<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  texture_callback.texture_dimensions = texture_dimensions;
  mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)element;
  texture_callback.background_border_geometry = (Geometry *)render_manager;
  texture_callback.element = border_radius._M_elems._0_8_;
  texture_callback.border_radius._M_elems._0_8_ = border_radius._M_elems._8_8_;
  __range1 = (BoxShadowList *)texture_callback.border_radius._M_elems._8_8_;
  ::std::vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_>::vector
            ((vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)
             &texture_callback.element_offset_in_texture,
             (vector<Rml::BoxShadow,_std::allocator<Rml::BoxShadow>_> *)background_border_geometry);
  Geometry::Release((Mesh *)local_278,(Geometry *)this,ClearMesh);
  local_285 = (uchar)(int)(opacity * 255.0);
  local_290 = Vector2<float>::operator-((Vector2<float> *)&texture_dimensions);
  local_298 = Vector2::operator_cast_to_Vector2((Vector2 *)&__range1);
  Colour<unsigned_char,_255,_true>::Colour(&local_29c,local_285,local_285);
  MeshUtilities::GenerateQuad((Mesh *)local_278,local_290,local_298,local_29c);
  ::std::function<bool(Rml::CallbackTextureInterface_const&)>::
  function<Rml::GeometryBoxShadow::Generate(Rml::Geometry&,Rml::CallbackTexture&,Rml::RenderManager&,Rml::Element*,Rml::Geometry&,std::vector<Rml::BoxShadow,std::allocator<Rml::BoxShadow>>,std::array<float,4ul>,float)::__0,void>
            ((function<bool(Rml::CallbackTextureInterface_const&)> *)(local_2e0 + 0x10),
             (anon_class_72_6_c04b40ea *)
             &mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  RenderManager::MakeCallbackTexture
            ((RenderManager *)local_2b0,(CallbackTextureFunction *)out_shadow_texture);
  CallbackTexture::operator=((CallbackTexture *)out_shadow_geometry,(CallbackTexture *)local_2b0);
  CallbackTexture::~CallbackTexture((CallbackTexture *)local_2b0);
  ::std::function<bool_(const_Rml::CallbackTextureInterface_&)>::~function
            ((function<bool_(const_Rml::CallbackTextureInterface_&)> *)(local_2e0 + 0x10));
  RenderManager::MakeGeometry((RenderManager *)local_2e0,(Mesh *)out_shadow_texture);
  Geometry::operator=((Geometry *)this,(Geometry *)local_2e0);
  Geometry::~Geometry((Geometry *)local_2e0);
  Mesh::~Mesh((Mesh *)local_278);
  Generate(Rml::Geometry&,Rml::CallbackTexture&,Rml::RenderManager&,Rml::Element*,Rml::Geometry&,std::vector<Rml::BoxShadow,std::allocator<Rml::BoxShadow>>,std::array<float,4ul>,float)
  ::$_0::~__0((__0 *)&mesh.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void GeometryBoxShadow::Generate(Geometry& out_shadow_geometry, CallbackTexture& out_shadow_texture, RenderManager& render_manager, Element* element,
	Geometry& background_border_geometry, BoxShadowList shadow_list, const CornerSizes border_radius, const float opacity)
{
	// Find the box-shadow texture dimension and offset required to cover all box-shadows and element boxes combined.
	Vector2f element_offset_in_texture;
	Vector2i texture_dimensions;

	// Resolve all lengths to px units.
	for (BoxShadow& shadow : shadow_list)
	{
		shadow.blur_radius = NumericValue(element->ResolveLength(shadow.blur_radius), Unit::PX);
		shadow.spread_distance = NumericValue(element->ResolveLength(shadow.spread_distance), Unit::PX);
		shadow.offset_x = NumericValue(element->ResolveLength(shadow.offset_x), Unit::PX);
		shadow.offset_y = NumericValue(element->ResolveLength(shadow.offset_y), Unit::PX);
	}

	{
		Vector2f extend_min;
		Vector2f extend_max;

		// Extend the render-texture to encompass box-shadow blur and spread.
		for (const BoxShadow& shadow : shadow_list)
		{
			if (!shadow.inset)
			{
				const float extend = 1.5f * shadow.blur_radius.number + shadow.spread_distance.number;
				const Vector2f offset = {shadow.offset_x.number, shadow.offset_y.number};
				extend_min = Math::Min(extend_min, offset - Vector2f(extend));
				extend_max = Math::Max(extend_max, offset + Vector2f(extend));
			}
		}

		Rectanglef texture_region;

		// Extend the render-texture further to cover all the element's boxes.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			const RenderBox box = element->GetRenderBox(BoxArea::Border, i);
			texture_region = texture_region.Join(Rectanglef::FromPositionSize(box.GetBorderOffset(), box.GetFillSize()));
		}

		texture_region = texture_region.Extend(-extend_min, extend_max);
		Math::ExpandToPixelGrid(texture_region);

		element_offset_in_texture = -texture_region.TopLeft();
		texture_dimensions = Vector2i(texture_region.Size());
	}

	// Callback for generating the box-shadow texture. Using a callback ensures that the texture can be regenerated at any time, for example if the
	// device loses its GPU context and the client calls Rml::ReleaseTextures().
	auto texture_callback = [&background_border_geometry, element, border_radius, texture_dimensions, element_offset_in_texture,
								shadow_list = std::move(shadow_list)](const CallbackTextureInterface& texture_interface) -> bool {
		RenderManager& render_manager = texture_interface.GetRenderManager();

		Mesh mesh_padding;        // Render geometry for inner box-shadow.
		Mesh mesh_padding_border; // Clipping mask for outer box-shadow.

		bool has_inner_shadow = false;
		bool has_outer_shadow = false;
		for (const BoxShadow& shadow : shadow_list)
		{
			if (shadow.inset)
				has_inner_shadow = true;
			else
				has_outer_shadow = true;
		}

		// Generate the geometry for all the element's boxes and extend the render-texture further to cover all of them.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			ColourbPremultiplied white(255);
			if (has_inner_shadow)
				MeshUtilities::GenerateBackground(mesh_padding, element->GetRenderBox(BoxArea::Padding, i), white);
			if (has_outer_shadow)
				MeshUtilities::GenerateBackground(mesh_padding_border, element->GetRenderBox(BoxArea::Border, i), white);
		}

		const RenderState initial_render_state = render_manager.GetState();
		render_manager.ResetState();
		render_manager.SetScissorRegion(Rectanglei::FromSize(texture_dimensions));

		// The scissor region will be clamped to the current window size, check the resulting scissor region.
		const Rectanglei scissor_region = render_manager.GetScissorRegion();
		if (scissor_region.Width() <= 0 || scissor_region.Height() <= 0)
		{
			// The window may become zero-sized for example when minimized. Just skip the texture generation for now, we
			// expect to be called again later when the window is restored.
			render_manager.SetState(initial_render_state);
			return false;
		}
		if (scissor_region != Rectanglei::FromSize(texture_dimensions))
		{
			Log::Message(Log::LT_INFO,
				"The desired box-shadow texture dimensions (%d, %d) are larger than the current window region (%d, %d). "
				"Results may be clipped. In element: %s",
				texture_dimensions.x, texture_dimensions.y, scissor_region.Width(), scissor_region.Height(), element->GetAddress().c_str());
		}

		render_manager.PushLayer();

		background_border_geometry.Render(element_offset_in_texture);

		for (int shadow_index = (int)shadow_list.size() - 1; shadow_index >= 0; shadow_index--)
		{
			const BoxShadow& shadow = shadow_list[shadow_index];
			const Vector2f shadow_offset = {shadow.offset_x.number, shadow.offset_y.number};
			const bool inset = shadow.inset;
			const float spread_distance = shadow.spread_distance.number;
			const float blur_radius = shadow.blur_radius.number;

			CornerSizes spread_radii = border_radius;
			for (int i = 0; i < 4; i++)
			{
				float& radius = spread_radii[i];
				float spread_factor = (inset ? -1.f : 1.f);
				if (radius < spread_distance)
				{
					const float ratio_minus_one = (radius / spread_distance) - 1.f;
					spread_factor *= 1.f + ratio_minus_one * ratio_minus_one * ratio_minus_one;
				}
				radius = Math::Max(radius + spread_factor * spread_distance, 0.f);
			}

			Mesh mesh_shadow;

			// Generate the shadow geometry. For outer box-shadows it is rendered normally, while for inset box-shadows it is used as a clipping mask.
			for (int i = 0; i < element->GetNumBoxes(); i++)
			{
				const float signed_spread_distance = (inset ? -spread_distance : spread_distance);
				RenderBox render_box = element->GetRenderBox(inset ? BoxArea::Padding : BoxArea::Border, i);
				render_box.SetFillSize(Math::Max(render_box.GetFillSize() + Vector2f(2.f * signed_spread_distance), Vector2f{0.001f}));
				render_box.SetBorderRadius(spread_radii);
				render_box.SetBorderOffset(render_box.GetBorderOffset() - Vector2f(signed_spread_distance));
				MeshUtilities::GenerateBackground(mesh_shadow, render_box, shadow.color);
			}

			CompiledFilter blur;
			if (blur_radius >= 0.5f)
			{
				blur = render_manager.CompileFilter("blur", Dictionary{{"sigma", Variant(0.5f * blur_radius)}});
				if (blur)
					render_manager.PushLayer();
			}

			Geometry geometry_shadow = render_manager.MakeGeometry(std::move(mesh_shadow));

			if (inset)
			{
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_shadow, shadow_offset + element_offset_in_texture);

				for (Rml::Vertex& vertex : mesh_padding.vertices)
					vertex.colour = shadow.color;

				// @performance: Don't need to copy the mesh if this is the last use of it.
				Geometry geometry_padding = render_manager.MakeGeometry(Mesh(mesh_padding));
				geometry_padding.Render(element_offset_in_texture);

				render_manager.SetClipMask(ClipMaskOperation::Set, &geometry_padding, element_offset_in_texture);
			}
			else
			{
				Mesh mesh = mesh_padding_border;
				Geometry geometry_padding_border = render_manager.MakeGeometry(std::move(mesh));
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_padding_border, element_offset_in_texture);
				geometry_shadow.Render(shadow_offset + element_offset_in_texture);
			}

			if (blur)
			{
				FilterHandleList filters;
				blur.AddHandleTo(filters);
				render_manager.CompositeLayers(render_manager.GetTopLayer(), render_manager.GetNextLayer(), BlendMode::Blend, filters);
				render_manager.PopLayer();
				blur.Release();
			}
		}

		texture_interface.SaveLayerAsTexture();

		render_manager.PopLayer();
		render_manager.SetState(initial_render_state);

		return true;
	};

	Mesh mesh = out_shadow_geometry.Release(Geometry::ReleaseMode::ClearMesh);
	const byte alpha = byte(opacity * 255.f);
	MeshUtilities::GenerateQuad(mesh, -element_offset_in_texture, Vector2f(texture_dimensions), ColourbPremultiplied(alpha, alpha));

	out_shadow_texture = render_manager.MakeCallbackTexture(std::move(texture_callback));
	out_shadow_geometry = render_manager.MakeGeometry(std::move(mesh));
}